

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

double __thiscall merlin::factor::distance(factor *this,factor *F2,Distance type)

{
  double dVar1;
  pointer pdVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  factor *this_00;
  undefined4 extraout_var_00;
  undefined8 extraout_RAX;
  runtime_error *this_01;
  long lVar6;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  value vVar7;
  value vVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  value local_e0;
  factor F;
  factor Ftmp;
  undefined4 extraout_var;
  
  bVar4 = variable_set::operator==(&this->v_,&F2->v_);
  if (!bVar4) {
    __assert_fail("vars() == F2.vars()",
                  "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/include/factor.h"
                  ,0x4c7,"double merlin::factor::distance(const factor &, Distance) const");
  }
  factor(&F,this);
  factor(&Ftmp,1.0);
  switch(type.t_) {
  case L1:
    binaryOpIP<merlin::factor::binOpMinus>(&F);
    iVar5 = abs(&F,(int)F2);
    this_00 = (factor *)CONCAT44(extraout_var,iVar5);
    goto LAB_00161d7f;
  case L2:
    this_00 = &F;
    binaryOpIP<merlin::factor::binOpMinus>(this_00,F2);
    binaryOpIP<merlin::factor::binOpTimes>(this_00,this_00);
LAB_00161d7f:
    local_e0 = sum(this_00);
    break;
  case LInf:
    binaryOpIP<merlin::factor::binOpMinus>(&F);
    iVar5 = abs(&F,(int)F2);
    local_e0 = max((factor *)CONCAT44(extraout_var_00,iVar5));
    break;
  case KL:
    vVar7 = sum(this);
    binaryOpIP<merlin::factor::binOpDivide>(&F,F2);
    vVar8 = sum(F2);
    binaryOpIP<merlin::factor::binOpTimes>((factor *)(vVar8 / vVar7),&F);
    log(&F,__x_01);
    binaryOpIP<merlin::factor::binOpTimes>(&F,this);
    vVar8 = sum(&F);
    local_e0 = vVar8 / vVar7;
    break;
  case HPM:
    binaryOpIP<merlin::factor::binOpDivide>(&F,F2);
    log(&F,__x_00);
    vVar7 = max(&F);
    vVar8 = min(&F);
    local_e0 = vVar7 - vVar8;
    break;
  case MAS:
    log(&F,__x);
    operator=(&Ftmp,F2);
    log(&Ftmp,__x_02);
    binaryOpIP<merlin::factor::binOpDivide>(&F,extraout_RAX);
    vVar7 = max(&F);
    vVar8 = min(&F);
    local_e0 = 1.0 / vVar8;
    if (1.0 / vVar8 <= vVar7) {
      local_e0 = vVar7;
    }
    local_e0 = local_e0 + -1.0;
    break;
  case OptGap:
    pdVar2 = (F2->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar12 = 0.0;
    dVar11 = 0.0;
    dVar9 = 0.0;
    dVar14 = 0.0;
    for (lVar6 = 0;
        (long)(this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != lVar6; lVar6 = lVar6 + 1) {
      dVar1 = F.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6];
      if (dVar1 <= dVar11) {
        dVar13 = pdVar2[lVar6];
        dVar10 = dVar9;
        if (((dVar11 == dVar1) && (!NAN(dVar11) && !NAN(dVar1))) &&
           (dVar10 = dVar13, dVar9 <= dVar13)) {
          dVar10 = dVar9;
        }
      }
      else {
        dVar13 = pdVar2[lVar6];
        dVar10 = dVar13;
        dVar11 = dVar1;
      }
      dVar9 = dVar1;
      if (((dVar13 <= dVar14) &&
          (bVar4 = NAN(dVar13), bVar3 = dVar14 == dVar13, dVar9 = dVar12, dVar13 = dVar14, bVar3))
         && ((!NAN(dVar14) && !bVar4 && (dVar9 = dVar1, dVar12 <= dVar1)))) {
        dVar9 = dVar12;
      }
      dVar12 = dVar9;
      dVar9 = dVar10;
      dVar14 = dVar13;
    }
    local_e0 = (dVar14 - dVar9) + (dVar11 - dVar12);
    break;
  default:
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Invalid distance type");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ~factor(&Ftmp);
  ~factor(&F);
  return local_e0;
}

Assistant:

double distance(factor const& F2, Distance type = Distance::L2) const {
		assert(vars() == F2.vars());
		factor F(*this), Ftmp;               // make a copy for manipulation
		double dist = -1.0;                   // local variables
		value Z;
		switch (type) {
		case Distance::L2:                // L2, sum of squared errors
			F -= F2;
			F *= F;
			dist = F.sum();
			break;
		case Distance::L1:               // L1, sum of absolute errors  (=TV !!)
			F -= F2;
			dist = F.abs().sum();
			break;
		case Distance::LInf:              // L-infinity, max absolute error
			F -= F2;
			dist = F.abs().max();
			break;
		case Distance::KL:                // KL-divergence (relative entropy)
			Z = sum();
			F /= F2;
			F *= F2.sum() / Z;
			F.log();
			F *= *this;
			dist = F.sum() / Z;
			break;
		case Distance::HPM:               // Hilbert's projective metric
			F /= F2;
			F.log();
			dist = F.max() - F.min(); //   aka "dynamic range"
			break;
		case Distance::MAS:               // "MAS" error value (not a metric)
			F.log();
			Ftmp = F2;
			F /= Ftmp.log();
			dist = std::max(F.max(), 1.0 / F.min()) - 1.0;
			break;
		case Distance::OptGap:            // "Primal/Dual Gap"-like
			double mx1, mx2, gap1, gap2;
			mx1 = mx2 = gap1 = gap2 = 0.0;
			for (size_t i = 0; i < num_states(); ++i) {
				if (mx1 < F[i]) {
					gap2 = F2[i];
					mx1 = F[i];
				} else if (mx1 == F[i])
					gap2 = std::min(gap2, F2[i]);
				if (mx2 < F2[i]) {
					gap1 = F[i];
					mx2 = F2[i];
				} else if (mx2 == F2[i])
					gap1 = std::min(gap1, F[i]);
			}
			return (mx1 - gap1) + (mx2 - gap2);
			break;
			//case Distance::Hellinger:   (!!)
			//  F^=0.5; F-=F2^0.5; F*=F; dist=(0.5*F.sum())^0.5;  // straightforward computation
			//  F*=F2; F^=0.5; dist=(1-F.sum())^0.5;              // alternate computation if F,F2 normalized
			//	break;
		default:
			throw std::runtime_error("Invalid distance type");
		}
		return dist;
	}